

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void take_line_escaped_newline(Env *env)

{
  _Bool _Var1;
  uint uVar2;
  
LAB_0010967e:
  do {
    _Var1 = (*env->lexer->eof)(env->lexer);
    uVar2 = env->lexer->lookahead;
    if (!_Var1) {
      if (uVar2 == 0x5c) goto LAB_001096a5;
      if ((uVar2 < 0xe) && ((0x3400U >> (uVar2 & 0x1f) & 1) != 0)) {
        return;
      }
LAB_001096de:
      advance(env);
      goto LAB_0010967e;
    }
    if (uVar2 != 0x5c) {
      return;
    }
LAB_001096a5:
    advance(env);
    uVar2 = env->lexer->lookahead;
    if ((uVar2 != 0x20) && (uVar2 != 9)) goto LAB_001096de;
    while (uVar2 < 0x21) {
      if ((0x100000200U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        if ((0x3400UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_001096de;
        break;
      }
      advance(env);
      uVar2 = env->lexer->lookahead;
    }
  } while( true );
}

Assistant:

static void take_line_escaped_newline(Env *env) {
  for (;;) {
    while (not_eof(env) && !is_newline(PEEK) && PEEK != '\\') S_ADVANCE;
    if (PEEK == '\\') {
      S_ADVANCE;
      if (is_space_or_tab(PEEK)) {
        while (is_space_or_tab(PEEK)) S_ADVANCE;
        if (is_newline(PEEK)) S_ADVANCE;
      }
      else S_ADVANCE;
    }
    else return;
  }
}